

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineeFrameInfo.h
# Opt level: O2

InlineeFrameRecord *
InlineeFrameRecord::New
          (Allocator *alloc,uint argCount,uint constantCount,intptr_t functionBodyAddr,
          InlineeFrameInfo *frameInfo)

{
  InlineeFrameRecord *pIVar1;
  IntType<(DataDesc)1> *pIVar2;
  VarType<(DataDesc)2> *pVVar3;
  
  pIVar1 = (InlineeFrameRecord *)
           new<NativeCodeData::AllocatorT<InlineeFrameRecord>>
                     (0x58,(AllocatorT<InlineeFrameRecord> *)alloc,0x5102c4);
  pIVar1->argCount = argCount;
  (pIVar1->floatArgs).word = 0;
  (pIVar1->losslessInt32Args).word = 0;
  pIVar1->functionBody = (FunctionBody *)functionBodyAddr;
  pIVar1->frameInfo = frameInfo;
  pIVar2 = Memory::
           AllocateArray<NativeCodeData::AllocatorNoFixup<NativeCodeData::Array<IntType<(DataDesc)1>>>,IntType<(DataDesc)1>,false>
                     ((Memory *)alloc,
                      (AllocatorNoFixup<NativeCodeData::Array<IntType<(DataDesc)1>_>_> *)
                      NativeCodeData::
                      AllocatorNoFixup<NativeCodeData::Array<IntType<(DataDesc)1>_>_>::Alloc,0,
                      (ulong)argCount);
  pIVar1->argOffsets = &pIVar2->data;
  pVVar3 = Memory::
           AllocateArray<NativeCodeData::AllocatorNoFixup<NativeCodeData::Array<VarType<(DataDesc)2>>>,VarType<(DataDesc)2>,false>
                     ((Memory *)alloc,
                      (AllocatorNoFixup<NativeCodeData::Array<VarType<(DataDesc)2>_>_> *)
                      NativeCodeData::
                      AllocatorNoFixup<NativeCodeData::Array<VarType<(DataDesc)2>_>_>::Alloc,0,
                      (ulong)constantCount);
  pIVar1->constants = &pVVar3->data;
  pIVar1->constantCount = constantCount;
  return pIVar1;
}

Assistant:

static InlineeFrameRecord* New(NativeCodeData::Allocator* alloc, uint argCount, uint constantCount, intptr_t functionBodyAddr, InlineeFrameInfo* frameInfo)
    {
        InlineeFrameRecord* record = NativeCodeDataNewZ(alloc, InlineeFrameRecord, argCount, (Js::FunctionBody*)functionBodyAddr, frameInfo);
        record->argOffsets = (int*)NativeCodeDataNewArrayNoFixup(alloc, IntType<DataDesc_InlineeFrameRecord_ArgOffsets>, argCount);
        record->constants = (Js::Var*)NativeCodeDataNewArrayNoFixup(alloc, VarType<DataDesc_InlineeFrameRecord_Constants>, constantCount);
        DebugOnly(record->constantCount = constantCount);
        return record;
    }